

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_store.hxx
# Opt level: O1

void __thiscall
nuraft::log_store::compact_async(log_store *this,ulong last_log_index,handler_type *when_done)

{
  int iVar1;
  bool rc;
  ptr<std::exception> exp;
  bool local_19;
  shared_ptr<std::exception> local_18;
  
  iVar1 = (*this->_vptr_log_store[0xe])();
  local_19 = SUB41(iVar1,0);
  local_18.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_18.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((when_done->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*when_done->_M_invoker)((_Any_data *)when_done,&local_19,&local_18);
    if (local_18.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_18.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

virtual void compact_async(ulong last_log_index,
                               const async_result<bool>::handler_type& when_done) {
        bool rc = compact(last_log_index);
        ptr<std::exception> exp(nullptr);
        when_done(rc, exp);
    }